

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall
ktx::ValidationContext::error<char_const(&)[10],unsigned_int&,int>
          (ValidationContext *this,IssueError *issue,char (*args) [10],uint *args_1,int *args_2)

{
  char *pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args_00;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  char (*local_68 [2]) [10];
  ulong local_58;
  ulong local_48;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_b0[0] = (issue->super_Issue).type;
  local_b0._2_2_ = (issue->super_Issue).id;
  pcVar1 = (issue->super_Issue).message._M_str;
  local_a8._M_p = (pointer)&local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,pcVar1,pcVar1 + (issue->super_Issue).message._M_len);
  local_58 = (ulong)*args_1;
  local_48 = (ulong)(uint)*args_2;
  fmt.size_ = 300;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args_00.field_1.args_ = in_R9.args_;
  args_00.desc_ = (unsigned_long_long)local_68;
  local_68[0] = args;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_88,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  if ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->callback)._M_invoker)((_Any_data *)&this->callback,(ValidationReport *)local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_p != &local_98) {
      operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }